

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

void __thiscall testing::internal::FilePath::Normalize(FilePath *this)

{
  char *pcVar1;
  size_type sVar2;
  size_type sVar3;
  char *pcVar4;
  char cVar5;
  
  pcVar1 = (this->pathname_)._M_dataplus._M_p;
  sVar2 = (this->pathname_)._M_string_length;
  pcVar4 = pcVar1;
  for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
    cVar5 = pcVar1[sVar3];
    if (((cVar5 != '/') || (cVar5 = '/', pcVar4 == (this->pathname_)._M_dataplus._M_p)) ||
       (pcVar4[-1] != '/')) {
      *pcVar4 = cVar5;
      pcVar4 = pcVar4 + 1;
    }
  }
  std::__cxx11::string::erase
            (this,pcVar4,(this->pathname_)._M_dataplus._M_p + (this->pathname_)._M_string_length);
  return;
}

Assistant:

void FilePath::Normalize() {
  auto out = pathname_.begin();

  for (const char character : pathname_) {
    if (!IsPathSeparator(character)) {
      *(out++) = character;
    } else if (out == pathname_.begin() || *std::prev(out) != kPathSeparator) {
      *(out++) = kPathSeparator;
    } else {
      continue;
    }
  }

  pathname_.erase(out, pathname_.end());
}